

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int fts3ExprCheckDepth(Fts3Expr *p,int nMaxDepth)

{
  uint in_ESI;
  long in_RDI;
  int rc;
  int in_stack_ffffffffffffffec;
  int iVar1;
  
  iVar1 = 0;
  if (in_RDI != 0) {
    if ((int)in_ESI < 0) {
      iVar1 = 0x12;
    }
    else {
      iVar1 = fts3ExprCheckDepth((Fts3Expr *)((ulong)in_ESI << 0x20),in_stack_ffffffffffffffec);
      if (iVar1 == 0) {
        iVar1 = fts3ExprCheckDepth((Fts3Expr *)((ulong)in_ESI << 0x20),in_stack_ffffffffffffffec);
      }
    }
  }
  return iVar1;
}

Assistant:

static int fts3ExprCheckDepth(Fts3Expr *p, int nMaxDepth){
  int rc = SQLITE_OK;
  if( p ){
    if( nMaxDepth<0 ){
      rc = SQLITE_TOOBIG;
    }else{
      rc = fts3ExprCheckDepth(p->pLeft, nMaxDepth-1);
      if( rc==SQLITE_OK ){
        rc = fts3ExprCheckDepth(p->pRight, nMaxDepth-1);
      }
    }
  }
  return rc;
}